

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
cs::compiler_type::gen_tree
          (compiler_type *this,tree_type<cs::token_base_*> *tree,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *raw)

{
  _func_int **pp_Var1;
  tree_type<cs::token_base_*> *ptVar2;
  int iVar3;
  size_type sVar4;
  token_base *ptVar5;
  undefined4 extraout_var;
  _func_int *p_Var6;
  token_base **it;
  tree_type<cs::token_base_*> *__x;
  tree_type<cs::token_base_*> *ptVar7;
  compiler_type *this_00;
  tree_type<cs::token_base_*> *ptVar8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *list;
  _func_int **pp_Var9;
  tree_type<cs::token_base_*> t;
  size_t local_108;
  _func_int **local_100;
  tree_type<cs::token_base_*> local_d8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  token_base *obj;
  
  ptVar7 = tree;
  tree_type<cs::token_base_*>::clear(tree);
  sVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size(raw);
  if (sVar4 == 1) {
    ptVar5 = *(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    obj = ptVar5;
    if (ptVar5 != (token_base *)0x0) {
      iVar3 = (*ptVar5->_vptr_token_base[2])(ptVar5);
      if (iVar3 == 9) {
        std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base
                  ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&tokens);
        pp_Var9 = ptVar5[2]._vptr_token_base;
        local_100 = ptVar5[3]._vptr_token_base;
        local_108 = ptVar5[3].line_num;
        pp_Var1 = ptVar5[4]._vptr_token_base;
        while (pp_Var9 != pp_Var1) {
          __x = (tree_type<cs::token_base_*> *)pp_Var9[2];
          ptVar8 = (tree_type<cs::token_base_*> *)pp_Var9[4];
          p_Var6 = pp_Var9[5];
          ptVar2 = (tree_type<cs::token_base_*> *)pp_Var9[6];
          while (__x != ptVar2) {
            ptVar7 = __x;
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                      (&tokens,(value_type *)__x);
            __x = __x + 1;
            if (__x == ptVar8) {
              __x = *(tree_type<cs::token_base_*> **)(p_Var6 + 8);
              p_Var6 = p_Var6 + 8;
              ptVar8 = __x + 0x40;
            }
          }
          t.mRoot = (tree_node *)token_base::operator_new((token_base *)0x18,(size_t)ptVar7);
          (t.mRoot)->left = (tree_node *)0x1;
          (t.mRoot)->root = (tree_node *)&PTR__token_base_00375610;
          *(undefined4 *)&(t.mRoot)->right = 0xd;
          ptVar7 = &t;
          std::deque<cs::token_base*,std::allocator<cs::token_base*>>::emplace_back<cs::token_base*>
                    ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)&tokens,
                     (token_base **)ptVar7);
          pp_Var9 = pp_Var9 + 10;
          if (pp_Var9 == local_100) {
            pp_Var9 = *(_func_int ***)(local_108 + 8);
            local_108 = local_108 + 8;
            local_100 = pp_Var9 + 0x3c;
          }
        }
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::pop_back(&tokens);
        ptVar7 = &t;
        t.mRoot = (tree_node *)0x0;
        gen_tree(this,ptVar7,&tokens);
        ptVar5 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)ptVar7);
        iVar3 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)t.mRoot,(EVP_PKEY_CTX *)0x0);
        ptVar5->line_num = 1;
        ptVar5->_vptr_token_base = (_func_int **)&PTR__token_expr_00375700;
        ptVar5[1]._vptr_token_base = (_func_int **)CONCAT44(extraout_var,iVar3);
        local_d8.mRoot = (tree_node *)0x0;
        obj = ptVar5;
        tree_type<cs::token_base_*>::~tree_type(&local_d8);
        tree_type<cs::token_base_*>::~tree_type(&t);
        std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                  (&tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
      }
    }
    tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
              ((tree_type<cs::token_base*> *)tree,tree->mRoot,&obj);
  }
  else {
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base
              (&tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
    this_00 = (compiler_type *)&obj;
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base
              ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)this_00);
    split_token(this_00,raw,&tokens,
                (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&obj);
    build_tree(this,tree,&tokens,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&obj)
    ;
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
              ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&obj);
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
              (&tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
  }
  optimize_expression(this,tree,normal);
  return;
}

Assistant:

void compiler_type::gen_tree(tree_type<token_base *> &tree, std::deque<token_base *> &raw)
	{
		tree.clear();
		if (raw.size() == 1) {
			token_base *obj = raw.front();
			if (obj != nullptr && obj->get_type() == token_types::sblist) {
				auto *sbl = static_cast<token_sblist *>(obj);
				std::deque<token_base *> tokens;
				for (auto &list: sbl->get_list()) {
					for (auto &it: list)
						tokens.push_back(it);
					tokens.push_back(new token_signal(signal_types::com_));
				}
				tokens.pop_back();
				tree_type<token_base *> t;
				gen_tree(t, tokens);
				obj = new token_expr(t);
			}
			tree.emplace_root_left(tree.root(), obj);
		}
		else {
			std::deque<token_base *> signals, objects;
			split_token(raw, signals, objects);
			build_tree(tree, signals, objects);
		}
		optimize_expression(tree);
	}